

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::OnClientTeamChange(CGameContext *this,int ClientID)

{
  int iVar1;
  int in_ESI;
  CGameContext *in_RDI;
  CProjectile *p;
  int in_stack_ffffffffffffffdc;
  CProjectile *local_18;
  
  iVar1 = CPlayer::GetTeam(in_RDI->m_apPlayers[in_ESI]);
  if (iVar1 == -1) {
    AbortVoteOnTeamChange(in_RDI,in_stack_ffffffffffffffdc);
  }
  for (local_18 = (CProjectile *)CGameWorld::FindFirst(&in_RDI->m_World,0);
      local_18 != (CProjectile *)0x0;
      local_18 = (CProjectile *)CEntity::TypeNext(&local_18->super_CEntity)) {
    iVar1 = CProjectile::GetOwner(local_18);
    if (iVar1 == in_ESI) {
      CProjectile::LoseOwner(local_18);
    }
  }
  return;
}

Assistant:

void CGameContext::OnClientTeamChange(int ClientID)
{
	if(m_apPlayers[ClientID]->GetTeam() == TEAM_SPECTATORS)
		AbortVoteOnTeamChange(ClientID);

	// mark client's projectile has team projectile
	CProjectile *p = (CProjectile *)m_World.FindFirst(CGameWorld::ENTTYPE_PROJECTILE);
	for(; p; p = (CProjectile *)p->TypeNext())
	{
		if(p->GetOwner() == ClientID)
			p->LoseOwner();
	}
}